

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O1

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  Mat *pMVar4;
  size_t sVar5;
  pointer pMVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  float *pfVar15;
  size_t sVar16;
  int iVar17;
  size_t *psVar18;
  void *pvVar19;
  void *pvVar20;
  size_t *psVar21;
  ulong uVar22;
  size_t sVar23;
  Mat *pMVar24;
  pointer pMVar25;
  int iVar26;
  Allocator **ppAVar27;
  uint uVar28;
  long lVar29;
  int *piVar30;
  uint uVar31;
  long lVar32;
  int *piVar33;
  undefined4 *puVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar38;
  undefined1 auVar37 [12];
  int iVar39;
  int *piVar40;
  float fVar41;
  Allocator *local_148;
  Mat local_138;
  Mat local_e8;
  int local_94;
  int local_90;
  int local_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  long local_70;
  size_t *local_68;
  int *local_60;
  long local_58;
  void *local_50;
  void *local_48;
  Mat *local_40;
  ulong local_38;
  
  if (this->int8_scale_term != 0) {
    iVar17 = forward_int8(this,bottom_blobs,top_blobs,opt);
    return iVar17;
  }
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar24 = pMVar4 + 1;
  if (this->constantA != 0) {
    pMVar24 = pMVar4;
    pMVar4 = &this->A_data;
  }
  if (this->constantB != 0) {
    pMVar24 = &this->B_data;
  }
  sVar5 = pMVar4->elemsize;
  local_138.cstep = 0;
  local_138.data = (void *)0x0;
  local_138.refcount._0_4_ = 0;
  local_138.refcount._4_4_ = 0;
  local_138.elemsize = 0;
  local_138.elempack = 0;
  local_138.allocator = (Allocator *)0x0;
  local_138.dims = 0;
  local_138.w = 0;
  local_138.h = 0;
  local_138.d = 0;
  local_138.c = 0;
  if (this->transA == 0) {
    if (&local_138 != pMVar4) {
      piVar30 = pMVar4->refcount;
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + 1;
        UNLOCK();
      }
      local_138.data = pMVar4->data;
      local_138.refcount._0_4_ = SUB84(pMVar4->refcount,0);
      local_138.refcount._4_4_ = (undefined4)((ulong)pMVar4->refcount >> 0x20);
      local_138.elemsize = pMVar4->elemsize;
      local_138.elempack = pMVar4->elempack;
      local_138.allocator = pMVar4->allocator;
      uVar7 = pMVar4->dims;
      uVar8 = pMVar4->w;
      uVar9 = pMVar4->h;
      uVar10 = pMVar4->d;
      local_138.w = uVar8;
      local_138.h = uVar9;
      local_138.d = uVar10;
      local_138.c = pMVar4->c;
      local_138.cstep = pMVar4->cstep;
      local_138.dims = uVar7;
    }
  }
  else {
    Mat::create(&local_138,(&pMVar4->h)[(ulong)(pMVar4->dims == 3) * 2],pMVar4->w,sVar5,
                opt->workspace_allocator);
    if (pMVar4->dims == 3) {
      iVar17 = (int)pMVar4->cstep;
    }
    else {
      iVar17 = pMVar4->w;
    }
    if (0 < (long)local_138.h) {
      lVar29 = 0;
      lVar32 = 0;
      pvVar20 = local_138.data;
      do {
        if (0 < local_138.w) {
          puVar34 = (undefined4 *)((long)pMVar4->data + lVar29);
          uVar35 = 0;
          do {
            *(undefined4 *)((long)pvVar20 + uVar35 * 4) = *puVar34;
            uVar35 = uVar35 + 1;
            puVar34 = puVar34 + iVar17;
          } while ((uint)local_138.w != uVar35);
        }
        lVar32 = lVar32 + 1;
        lVar29 = lVar29 + 4;
        pvVar20 = (void *)((long)pvVar20 + (long)local_138.w * local_138.elemsize);
      } while (lVar32 != local_138.h);
    }
  }
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  if (this->transB == 0) {
    Mat::create(&local_e8,(&pMVar24->h)[(ulong)(pMVar24->dims == 3) * 2],pMVar24->w,sVar5,
                opt->workspace_allocator);
    if (pMVar24->dims == 3) {
      iVar17 = (int)pMVar24->cstep;
    }
    else {
      iVar17 = pMVar24->w;
    }
    if (0 < (long)local_e8.h) {
      lVar29 = 0;
      lVar32 = 0;
      pvVar20 = local_e8.data;
      do {
        if (0 < local_e8.w) {
          puVar34 = (undefined4 *)((long)pMVar24->data + lVar29);
          uVar35 = 0;
          do {
            *(undefined4 *)((long)pvVar20 + uVar35 * 4) = *puVar34;
            uVar35 = uVar35 + 1;
            puVar34 = puVar34 + iVar17;
          } while ((uint)local_e8.w != uVar35);
        }
        lVar32 = lVar32 + 1;
        lVar29 = lVar29 + 4;
        pvVar20 = (void *)((long)pvVar20 + (long)local_e8.w * local_e8.elemsize);
      } while (lVar32 != local_e8.h);
    }
  }
  else if (&local_e8 != pMVar24) {
    piVar30 = pMVar24->refcount;
    if (piVar30 != (int *)0x0) {
      LOCK();
      *piVar30 = *piVar30 + 1;
      UNLOCK();
    }
    local_e8.data = pMVar24->data;
    local_e8.refcount._0_4_ = SUB84(pMVar24->refcount,0);
    local_e8.refcount._4_4_ = (undefined4)((ulong)pMVar24->refcount >> 0x20);
    local_e8.elemsize = pMVar24->elemsize;
    local_e8.elempack = pMVar24->elempack;
    local_e8.allocator = pMVar24->allocator;
    uVar11 = pMVar24->dims;
    uVar12 = pMVar24->w;
    uVar13 = pMVar24->h;
    uVar14 = pMVar24->d;
    local_e8.w = uVar12;
    local_e8.h = uVar13;
    local_e8.d = uVar14;
    local_e8.c = pMVar24->c;
    local_e8.cstep = pMVar24->cstep;
    local_e8.dims = uVar11;
  }
  iVar17 = (&local_138.h)[(ulong)(local_138.dims == 3) * 2];
  iVar3 = (&local_e8.h)[(ulong)(local_e8.dims == 3) * 2];
  if (this->constantC != 0) {
    piVar30 = (this->C_data).refcount;
    if (piVar30 != (int *)0x0) {
      LOCK();
      *piVar30 = *piVar30 + 1;
      UNLOCK();
    }
    pvVar20 = (this->C_data).data;
    piVar30 = (this->C_data).refcount;
    local_88 = SUB84(pvVar20,0);
    uStack_84 = (undefined4)((ulong)pvVar20 >> 0x20);
    uStack_80 = SUB84(piVar30,0);
    uStack_7c = (undefined4)((ulong)piVar30 >> 0x20);
    local_148 = (this->C_data).allocator;
    uVar28 = this->constant_broadcast_type_C;
    goto LAB_004cead3;
  }
  if ((this->constantB == 0 || this->constantA == 0) ||
     (pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start,
     (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_finish - (long)pMVar25 != 0x48)) {
    if ((this->constantA != 0 || this->constantB != 0) &&
       (pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start,
       (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pMVar6 == 0x90)) {
      piVar30 = pMVar6[1].refcount;
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + 1;
        UNLOCK();
      }
      pMVar25 = pMVar6 + 1;
      ppAVar27 = &pMVar6[1].allocator;
      piVar30 = &pMVar6[1].dims;
      piVar33 = &pMVar6[1].c;
      psVar18 = &pMVar6[1].cstep;
      goto LAB_004cee59;
    }
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar6 == 0xd8) {
      piVar30 = pMVar6[2].refcount;
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + 1;
        UNLOCK();
      }
      pMVar25 = pMVar6 + 2;
      ppAVar27 = &pMVar6[2].allocator;
      piVar30 = &pMVar6[2].dims;
      piVar33 = &pMVar6[2].c;
      psVar18 = &pMVar6[2].cstep;
      goto LAB_004cee59;
    }
    pvVar20 = (void *)0x0;
    piVar40 = (int *)0x0;
    auVar37 = SUB1612((undefined1  [16])0x0,0);
    sVar23 = 0;
    local_148 = (Allocator *)0x0;
    lVar29 = 0;
  }
  else {
    piVar30 = pMVar25->refcount;
    if (piVar30 != (int *)0x0) {
      LOCK();
      *piVar30 = *piVar30 + 1;
      UNLOCK();
    }
    ppAVar27 = &pMVar25->allocator;
    piVar30 = &pMVar25->dims;
    piVar33 = &pMVar25->c;
    psVar18 = &pMVar25->cstep;
LAB_004cee59:
    pvVar20 = pMVar25->data;
    piVar40 = pMVar25->refcount;
    auVar37 = SUB1612(*(undefined1 (*) [16])piVar30,0);
    lVar29 = (long)*piVar33;
    local_148 = *ppAVar27;
    sVar23 = *psVar18;
  }
  local_88 = SUB84(pvVar20,0);
  uStack_84 = (undefined4)((ulong)pvVar20 >> 0x20);
  uStack_80 = SUB84(piVar40,0);
  uStack_7c = (undefined4)((ulong)piVar40 >> 0x20);
  uVar28 = 0;
  if ((pvVar20 != (void *)0x0) && (sVar23 * lVar29 != 0)) {
    iVar26 = auVar37._0_4_;
    iVar38 = auVar37._4_4_;
    iVar39 = auVar37._8_4_;
    uVar28 = (uint)(iVar38 == iVar17 && iVar26 == 1);
    uVar31 = uVar28;
    if (iVar38 == iVar3) {
      uVar31 = 4;
    }
    if (iVar26 != 1) {
      uVar31 = uVar28;
    }
    uVar28 = 2;
    if (iVar39 != iVar17) {
      uVar28 = uVar31;
    }
    if (iVar38 != 1) {
      uVar28 = uVar31;
    }
    if (iVar26 != 2) {
      uVar28 = uVar31;
    }
    uVar31 = 3;
    if (iVar39 != iVar17) {
      uVar31 = uVar28;
    }
    if (iVar38 != iVar3) {
      uVar31 = uVar28;
    }
    if ((iVar26 == 2) && (uVar28 = uVar31, iVar39 == 1 && iVar38 == iVar3)) {
      uVar28 = 4;
    }
  }
LAB_004cead3:
  iVar26 = iVar3;
  if (this->output_transpose == 0) {
    iVar26 = iVar17;
    iVar17 = iVar3;
  }
  pMVar24 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (this->output_N1M == 0) {
    Mat::create(pMVar24,iVar17,iVar26,sVar5,opt->blob_allocator);
  }
  else {
    Mat::create(pMVar24,iVar17,1,iVar26,sVar5,opt->blob_allocator);
  }
  iVar17 = -100;
  if ((pMVar24->data != (void *)0x0) && ((long)pMVar24->c * pMVar24->cstep != 0)) {
    local_8c = local_138.dims;
    if ((&local_138.h)[(ulong)(local_138.dims == 3) * 2] < 1) {
      iVar17 = 0;
    }
    else {
      fVar1 = this->alpha;
      fVar2 = this->beta;
      local_90 = local_e8.dims;
      uVar31 = (&local_e8.h)[(ulong)(local_e8.dims == 3) * 2];
      iVar17 = this->output_transpose;
      local_94 = pMVar24->dims;
      local_48 = local_138.data;
      pfVar15 = (float *)CONCAT44(uStack_84,local_88);
      local_50 = local_e8.data;
      local_58 = (long)(int)uVar31;
      local_38 = (ulong)(uint)(&local_138.h)[(ulong)(local_138.dims == 3) * 2];
      local_70 = 0;
      local_60 = &pMVar24->w;
      local_68 = &pMVar24->cstep;
      uVar35 = 0;
      do {
        psVar18 = (size_t *)&local_138.w;
        if (local_138.dims == 3) {
          psVar18 = &local_138.cstep;
        }
        if (0 < (int)uVar31) {
          psVar21 = (size_t *)&local_e8.w;
          if (local_e8.dims == 3) {
            psVar21 = &local_e8.cstep;
          }
          sVar5 = *psVar18;
          sVar23 = *psVar21;
          psVar18 = (size_t *)local_60;
          if (local_94 == 3) {
            psVar18 = local_68;
          }
          sVar16 = *psVar18;
          pvVar20 = pMVar24->data;
          uVar36 = 0;
          pvVar19 = local_e8.data;
          do {
            fVar41 = 0.0;
            if (pfVar15 != (float *)0x0) {
              if (uVar28 == 0) {
                fVar41 = *pfVar15;
              }
              if (uVar28 == 1) {
                fVar41 = pfVar15[uVar35];
              }
              if (uVar28 == 2) {
                fVar41 = pfVar15[uVar35];
              }
              if (uVar28 == 3) {
                fVar41 = pfVar15[uVar35 * local_58 + uVar36];
              }
              if (uVar28 == 4) {
                fVar41 = pfVar15[uVar36];
              }
              fVar41 = fVar41 * fVar2;
            }
            if (0 < local_138.w) {
              uVar22 = 0;
              do {
                fVar41 = fVar41 + *(float *)((long)pvVar19 + uVar22 * 4) *
                                  *(float *)((long)local_138.data +
                                            uVar22 * 4 + (int)sVar5 * local_70);
                uVar22 = uVar22 + 1;
              } while ((uint)local_138.w != uVar22);
            }
            lVar29 = uVar36 * (long)(int)sVar16 * 4 + uVar35 * 4;
            if (iVar17 == 0) {
              lVar29 = uVar36 * 4 + uVar35 * (long)(int)sVar16 * 4;
            }
            *(float *)((long)pvVar20 + lVar29) = fVar41 * fVar1;
            uVar36 = uVar36 + 1;
            pvVar19 = (void *)((long)pvVar19 + (long)(int)sVar23 * 4);
          } while (uVar36 != uVar31);
        }
        uVar35 = uVar35 + 1;
        local_70 = local_70 + 4;
      } while (uVar35 != local_38);
      iVar17 = 0;
      local_40 = pMVar24;
    }
  }
  piVar30 = (int *)CONCAT44(uStack_84,uStack_80);
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 == 0) {
      if (local_148 == (Allocator *)0x0) {
        if ((void *)CONCAT44(uStack_84,local_88) != (void *)0x0) {
          free((void *)CONCAT44(uStack_84,local_88));
        }
      }
      else {
        (*local_148->_vptr_Allocator[3])();
      }
    }
  }
  piVar30 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize = 0;
  local_e8.elempack = 0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  piVar30 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 == 0) {
      if (local_138.allocator == (Allocator *)0x0) {
        if (local_138.data != (void *)0x0) {
          free(local_138.data);
        }
      }
      else {
        (*(local_138.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif // NCNN_INT8

    const Mat& A0 = constantA ? A_data : bottom_blobs[0];
    const Mat& B0 = constantB ? B_data : constantA ? bottom_blobs[0] : bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create((A0.dims == 3 ? A0.c : A0.h), A0.w, elemsize, opt.workspace_allocator);

        const int A0_hstep = A0.dims == 3 ? (int)A0.cstep : A0.w;

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0[j * A0_hstep + i];
            }
        }
    }

    Mat BT;
    if (transB == 0)
    {
        // transpose B to col-major
        BT.create((B0.dims == 3 ? B0.c : B0.h), B0.w, elemsize, opt.workspace_allocator);

        const int B0_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;

        for (int i = 0; i < BT.h; i++)
        {
            float* ptr = BT.row(i);
            for (int j = 0; j < BT.w; j++)
            {
                ptr[j] = B0[j * B0_hstep + i];
            }
        }
    }
    else
    {
        BT = B0;
    }

    const int M = A.dims == 3 ? A.c : A.h;
    const int N = BT.dims == 3 ? BT.c : BT.h;

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = C_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB && bottom_blobs.size() == 1)
        {
            C = bottom_blobs[0];
        }
        else if ((constantA || constantB) && bottom_blobs.size() == 2)
        {
            C = bottom_blobs[1];
        }
        else if (bottom_blobs.size() == 3)
        {
            C = bottom_blobs[2];
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N, elemsize, opt.blob_allocator);
        else
            top_blob.create(M, N, elemsize, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M, elemsize, opt.blob_allocator);
        else
            top_blob.create(N, M, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    gemm_transB(A, BT, C, top_blob, alpha, beta, broadcast_type_C, output_transpose, opt);

    return 0;
}